

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_registry.c
# Opt level: O3

int curious_register_file(char *path,int fd,char *filesystem,char *mount_point)

{
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  curious_file_record_t new_record;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  
  puVar2 = (undefined8 *)get_from_curious_dynamic_array(&file_registry,fd);
  if (mount_point == (char *)0x0) {
    iVar1 = strncmp(path,"pipe:",5);
    if (iVar1 == 0) {
      mount_point = strdup(path);
    }
    else {
      mount_point = (char *)0x0;
    }
  }
  if (puVar2 == (undefined8 *)0x0) {
    local_40 = strdup(path);
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    local_38 = filesystem;
    local_30 = mount_point;
    set_in_curious_dynamic_array(&file_registry,&local_40,&local_58,fd);
  }
  else {
    pcVar3 = strdup(path);
    *puVar2 = pcVar3;
    puVar2[1] = filesystem;
    puVar2[2] = mount_point;
  }
  return 0;
}

Assistant:

int curious_register_file(const char* path, int fd, char* filesystem, char* mount_point)
{
    curious_file_record_t* cur_record = (curious_file_record_t*) get_from_curious_dynamic_array(&file_registry, fd);

    // If the file is a pipe, then identify the pipe as the 'mount point'
    if (NULL == mount_point && 0 == strncmp(path, "pipe:", 5)) {
        mount_point = strdup(path);
    }

    //printf("Registering %s on %s filesystem as fd %d\n", path, filesystem, fd);

    // If the fd hasn't been used before...
    if (NULL == cur_record) {
        // We need to set up a new record
        curious_file_record_t new_record;

        // ...and intialise its fields
        new_record.path        = strdup(path);
        new_record.filesystem  = filesystem;
        new_record.mount_point = mount_point;

        //Ditto for a blank record to fill any extra space created
        //by adding this file record
        curious_file_record_t blank_record;
        blank_record.path        = NULL;
        blank_record.filesystem  = NULL;
        blank_record.mount_point = NULL;

        set_in_curious_dynamic_array(&file_registry, &new_record, &blank_record, fd);

        // ...otherwise...
    } else {
        // ...all we need to do is intialise the feilds,
        // since we already have space for a record where we need it
        cur_record->path        = strdup(path);
        cur_record->filesystem  = filesystem;
        cur_record->mount_point = mount_point;
    }

    return 0;
}